

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerResults.cpp
# Opt level: O2

void __thiscall
PS2KeyboardAnalyzerResults::GenerateExportFile
          (PS2KeyboardAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  double dVar1;
  undefined4 uVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  ulonglong uVar6;
  ostream *poVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  char *__format;
  PS2KeyboardAnalyzerResults *pPVar13;
  Frame *this_00;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  char codetype [32];
  char device_str [16];
  Frame frame;
  PS2KeyboardAnalyzerResults *local_670;
  ulong local_668;
  byte local_65f;
  char key_str [64];
  char tmp_str [128];
  char num_str [128];
  char time_str [128];
  ofstream file_stream;
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  uVar6 = Analyzer::GetTriggerSample();
  uVar4 = Analyzer::GetSampleRate();
  if (export_type_user_id == 0) {
    dVar1 = this->mSettings->mDeviceType;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      uVar8 = AnalyzerResults::GetNumFrames();
      for (uVar4 = 0; uVar4 < uVar8; uVar4 = uVar4 + 1) {
        AnalyzerResults::GetFrame((ulonglong)num_str);
        cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulong)uVar4)
        ;
        if (cVar3 != '\0') {
          std::ofstream::close();
          this_00 = (Frame *)num_str;
          goto LAB_001083b8;
        }
        Frame::~Frame((Frame *)num_str);
      }
    }
    else {
      uVar8 = AnalyzerResults::GetNumFrames();
      for (uVar4 = 0; uVar4 < uVar8; uVar4 = uVar4 + 1) {
        pPVar13 = (PS2KeyboardAnalyzerResults *)tmp_str;
        AnalyzerResults::GetFrame((ulonglong)tmp_str);
        cVar3 = tmp_str[0x21];
        GetKey(pPVar13,num_str,CONCAT17(tmp_str[0x17],tmp_str._16_7_),(byte)tmp_str[0x21] & 8);
        if ((cVar3 & 2U) == 0) {
          if (-1 < cVar3) {
            if (0x3f < (byte)cVar3) {
              builtin_strncpy(num_str + 8,"REAK]",6);
              uVar9 = 0x422f45535541505b;
LAB_001082b3:
              num_str[0] = (char)uVar9;
              num_str._1_5_ = (undefined5)((ulong)uVar9 >> 8);
              num_str[6] = (char)((ulong)uVar9 >> 0x30);
              num_str[7] = (char)((ulong)uVar9 >> 0x38);
              goto LAB_001082bb;
            }
            if ((cVar3 & 0x10U) == 0 || (byte)cVar3 < 0x20) {
              if (0x1f < (byte)cVar3) {
                builtin_strncpy(num_str + 8,"CREEN]",7);
                uVar9 = 0x5320544e4952505b;
                goto LAB_001082b3;
              }
              if (((~cVar3 & 0x18U) != 0) && ((byte)cVar3 < 0x10)) goto LAB_001082bb;
            }
          }
LAB_0010828d:
          num_str[0] = '\0';
        }
        else if ((((tmp_str._24_7_ & 1) != 0) || ((tmp_str._24_7_ & 2) != 0)) ||
                ((tmp_str._24_7_ & 4) != 0)) goto LAB_0010828d;
LAB_001082bb:
        std::operator<<((ostream *)&file_stream,num_str);
        cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulong)uVar4)
        ;
        if (cVar3 != '\0') {
          std::ofstream::close();
          this_00 = (Frame *)tmp_str;
          goto LAB_001083b8;
        }
        Frame::~Frame((Frame *)tmp_str);
      }
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&file_stream,"Time [s], Originator, Type, Details, Raw Data"
                            );
    std::endl<char,std::char_traits<char>>(poVar7);
    uVar8 = AnalyzerResults::GetNumFrames();
    uVar17 = 0;
    while( true ) {
      if (uVar8 <= uVar17) break;
      AnalyzerResults::GetFrame((ulonglong)&frame);
      pPVar13 = _frame;
      AnalyzerHelpers::GetTimeString((ulonglong)_frame,uVar6,uVar4,time_str,0x80);
      if ((local_65f & 1) == 0) {
        dVar1 = this->mSettings->mDeviceType;
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          builtin_strncpy(device_str,"Mouse",6);
          uVar2 = device_str._0_4_;
          device_str._0_8_ = CONCAT44(device_str._4_4_,uVar2);
          GetKeyName(pPVar13,num_str,(U64)local_670,local_65f & 8);
          if ((local_65f & 2) == 0) {
            if ((local_65f & 0x20) == 0) {
              AnalyzerHelpers::GetNumberString((ulonglong)local_670,Hexadecimal,8,key_str,0x80);
              strcpy(tmp_str,key_str);
              codetype._4_4_ = SUB84(codetype._0_8_,4) & 0xffffff00;
              builtin_strncpy(codetype,"DATA",4);
LAB_00107ea3:
              num_str[0] = '\0';
            }
            else {
              AnalyzerHelpers::GetNumberString((ulonglong)local_670,Hexadecimal,0x20,key_str,0x80);
              strcpy(tmp_str,key_str);
              builtin_strncpy(codetype,"MOVEMENT",9);
              dVar1 = this->mSettings->mDeviceType;
              uVar11 = (ulong)((byte)(((ulong)local_670 & 0xffffffff) >> 7) & 1);
              uVar10 = (ulong)((byte)(((ulong)local_670 & 0xffffffff) >> 6) & 1);
              uVar14 = (ulong)((byte)(((ulong)local_670 & 0xffffffff) >> 5) & 1);
              uVar5 = (uint)((byte)(((ulong)local_670 & 0xffffffff) >> 4) & 1);
              uVar18 = (ulong)((byte)(((ulong)local_670 & 0xffffffff) >> 2) & 1);
              uVar16 = (ulong)((byte)(((ulong)local_670 & 0xffffffff) >> 1) & 1);
              uVar15 = (ulong)((byte)local_670 & 1);
              uVar12 = (uint)((ulong)local_670 >> 8);
              uVar19 = (uint)((ulong)local_670 >> 0x10);
              if ((dVar1 != 1.0) || (NAN(dVar1))) {
                sprintf(num_str,
                        "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, 4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d"
                        ,uVar11,uVar10,uVar14,(ulong)uVar5,uVar18,uVar16,uVar15,0,
                        (ulong)((uint)((ulong)local_670 >> 0x1d) & 1),(ulong)(uVar12 & 0xff),
                        (ulong)(uVar19 & 0xff),(ulong)((uint)local_670 >> 0x18 & 0xf));
              }
              else {
                sprintf(num_str,
                        "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, deltaX: %d, deltaY: %d"
                        ,uVar11,uVar10,uVar14,(ulong)uVar5,uVar18,uVar16,uVar15,
                        (ulong)(uVar12 & 0xff),(ulong)(uVar19 & 0xff));
              }
            }
          }
          else {
            if ((local_668 & 1) != 0) {
              AnalyzerHelpers::GetNumberString((ulonglong)local_670,Hexadecimal,8,key_str,0x80);
              strcpy(tmp_str,key_str);
              builtin_strncpy(codetype,"ACK",4);
              goto LAB_00107ea3;
            }
            if ((local_668 & 4) != 0) {
              AnalyzerHelpers::GetNumberString((ulonglong)local_670,Hexadecimal,8,key_str,0x80);
              strcpy(tmp_str,key_str);
              builtin_strncpy(codetype,"BAT",4);
              builtin_strncpy(num_str,"Power-On Self Test Successfull",0x1f);
            }
          }
          strcpy(key_str,tmp_str);
          poVar7 = std::operator<<((ostream *)&file_stream,time_str);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,device_str);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,codetype);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,num_str);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,key_str);
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        else {
          builtin_strncpy(device_str,"Keyboard",9);
          pPVar13 = local_670;
          AnalyzerHelpers::GetNumberString((ulonglong)local_670,Hexadecimal,8,num_str,0x20);
          GetKeyName(pPVar13,key_str,(U64)local_670,local_65f & 8);
          if ((local_65f & 2) == 0) {
            if ((char)local_65f < '\0') {
              strcpy(tmp_str,num_str);
              builtin_strncpy(codetype,"ERROR",6);
              builtin_strncpy(key_str,"INVALID CODE",0xd);
            }
            else {
              if (local_65f < 0x40) {
                if ((local_65f & 0x10) == 0 || local_65f < 0x20) {
                  if (local_65f < 0x20) {
                    if ((~local_65f & 0x18) == 0) {
                      __format = "0xE0, 0xF0, %s";
LAB_001079f9:
                      sprintf(tmp_str,__format,num_str);
                      builtin_strncpy(codetype,"BREAK",6);
                    }
                    else {
                      if ((local_65f & 8) == 0) {
                        if ((local_65f & 0x10) != 0) {
                          __format = "0xF0, %s";
                          goto LAB_001079f9;
                        }
                        strcpy(tmp_str,num_str);
                      }
                      else {
                        sprintf(tmp_str,"0xE0, %s",num_str);
                      }
                      builtin_strncpy(codetype,"MAKE",5);
                    }
                    goto LAB_00108099;
                  }
                  builtin_strncpy(tmp_str + 8,"12, 0xE0, 0x7C",0xf);
                  builtin_strncpy(codetype,"MAKE",5);
                }
                else {
                  builtin_strncpy(tmp_str + 8,"F0, 0x7C, 0xE0, 0xF0, 0x12",0x1b);
                  builtin_strncpy(codetype,"BREAK",6);
                }
                builtin_strncpy(tmp_str,"0xE0, 0x",8);
                builtin_strncpy(key_str + 1,"PRINT SCREEN]",0xe);
              }
              else {
                builtin_strncpy(tmp_str,"0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77",0x2f);
                codetype._0_8_ = codetype._0_8_ & 0xffffffffffffff00;
                builtin_strncpy(key_str + 1,"PAUSE/BREAK]",0xd);
              }
              key_str[0] = '[';
            }
          }
          else if ((local_668 & 1) == 0) {
            if ((local_668 & 2) == 0) {
              if ((local_668 & 4) != 0) {
                strcpy(tmp_str,num_str);
                builtin_strncpy(codetype,"BAT",4);
                builtin_strncpy(key_str,"Power-On Self Test Successfull",0x1f);
              }
            }
            else {
              strcpy(tmp_str,num_str);
              codetype._4_4_ = SUB84(codetype._0_8_,4) & 0xffffff00;
              builtin_strncpy(codetype,"ECHO",4);
              key_str[0] = '\0';
            }
          }
          else {
            strcpy(tmp_str,num_str);
            builtin_strncpy(codetype,"ACK",4);
            key_str[0] = '\0';
          }
LAB_00108099:
          strcpy(num_str,tmp_str);
          poVar7 = std::operator<<((ostream *)&file_stream,time_str);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,device_str);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,codetype);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,key_str);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,num_str);
          std::endl<char,std::char_traits<char>>(poVar7);
        }
      }
      else {
        device_str._4_4_ = SUB84(device_str._0_8_,4) & 0xffffff00;
        builtin_strncpy(device_str,"Host",4);
        pPVar13 = local_670;
        AnalyzerHelpers::GetNumberString((ulonglong)local_670,Hexadecimal,8,tmp_str,0x20);
        GetCommandName(pPVar13,key_str,(U64)local_670,this->mSettings->mDeviceType);
        sprintf(num_str,"%s: %s (%s)",device_str,key_str,tmp_str);
        poVar7 = std::operator<<((ostream *)&file_stream,time_str);
        poVar7 = std::operator<<(poVar7,",");
        poVar7 = std::operator<<(poVar7,device_str);
        poVar7 = std::operator<<(poVar7,",,");
        poVar7 = std::operator<<(poVar7,key_str);
        poVar7 = std::operator<<(poVar7,",");
        poVar7 = std::operator<<(poVar7,tmp_str);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulong)uVar17);
      if (cVar3 != '\0') {
        std::ofstream::close();
        this_00 = &frame;
LAB_001083b8:
        Frame::~Frame(this_00);
        goto LAB_001083bd;
      }
      Frame::~Frame(&frame);
      uVar17 = uVar17 + 1;
    }
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
  std::ofstream::close();
LAB_001083bd:
  std::ofstream::~ofstream(&file_stream);
  return;
}

Assistant:

void PS2KeyboardAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    if( export_type_user_id == 0 )
    {
        if( mSettings->mDeviceType == 0 )
        {
            // keys as text file, no output for mouse
            U64 num_frames = GetNumFrames();
            for( U32 i = 0; i < num_frames; i++ )
            {
                Frame frame = GetFrame( i );

                char key_str[ 64 ];

                // set the key based on the data, then if the context of the transmissions means its not correct, just make it an empty
                // string
                GetKey( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );

                // context checking, only allows make codes to generate a character in the file
                if( frame.mFlags & DATA_FRAME )
                {
                    if( frame.mData2 & ACK_FRAME )
                        sprintf( key_str, "" );
                    else if( frame.mData2 & ECHO_FRAME )
                        sprintf( key_str, "" );
                    else if( frame.mData2 & BAT_FRAME )
                        sprintf( key_str, "" );
                }
                else if( frame.mFlags & ERROR_FRAME )
                    sprintf( key_str, "" );
                else if( frame.mFlags & PAUSE_BREAK )
                    sprintf( key_str, "[PAUSE/BREAK]" );
                else if( frame.mFlags & PRINT_SCREEN && frame.mFlags & BREAK_CODE )
                    sprintf( key_str, "" );
                else if( frame.mFlags & PRINT_SCREEN )
                    sprintf( key_str, "[PRINT SCREEN]" );
                else if( frame.mFlags & EXTENDED_KEY && frame.mFlags & BREAK_CODE )
                    sprintf( key_str, "" );
                else if( frame.mFlags & BREAK_CODE )
                    sprintf( key_str, "" );

                file_stream << key_str;

                if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
                {
                    file_stream.close();
                    return;
                }
            }
        }
        else
        {
            // no output for mouse, but don't want the program to crash so put this here for stability
            U64 num_frames = GetNumFrames();
            for( U32 i = 0; i < num_frames; i++ )
            {
                Frame frame = GetFrame( i );

                if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
                {
                    file_stream.close();
                    return;
                }
            }
        }
    }
    else
    {
        // csv data log file, mouse & keyboard support

        // print column titles
        file_stream << "Time [s], Originator, Type, Details, Raw Data" << std::endl;

        U64 num_frames = GetNumFrames();
        for( U32 i = 0; i < num_frames; i++ )
        {
            Frame frame = GetFrame( i );

            char time_str[ 128 ];
            AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

            char device_str[ 16 ];
            if( frame.mFlags & TX_HOST_TO_DEVICE )
            {
                sprintf( device_str, "Host" );

                char num_str[ 128 ];
                AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

                char cmd_str[ 64 ];
                GetCommandName( cmd_str, frame.mData1, mSettings->mDeviceType );

                char result_str[ 255 ];

                // add key str
                sprintf( result_str, "%s: %s (%s)", device_str, cmd_str, num_str );

                file_stream << time_str << "," << device_str << ",," << cmd_str << "," << num_str << std::endl;
            }
            else
            {
                if( mSettings->mDeviceType == 0 )
                {
                    sprintf( device_str, "Keyboard" );

                    char num_str[ 128 ];
                    AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

                    char tmp_str[ 128 ];
                    char codetype[ 32 ];

                    char key_str[ 64 ];
                    GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );


                    if( frame.mFlags & DATA_FRAME )
                    {
                        if( frame.mData2 & ACK_FRAME )
                        {
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "ACK" );
                            sprintf( key_str, "" );
                        }
                        else if( frame.mData2 & ECHO_FRAME )
                        {
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "ECHO" );

                            sprintf( key_str, "" );
                        }
                        else if( frame.mData2 & BAT_FRAME )
                        {
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "BAT" );

                            sprintf( key_str, "Power-On Self Test Successfull" );
                        }
                    }
                    else if( frame.mFlags & ERROR_FRAME )
                    {
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "ERROR" );
                        sprintf( key_str, "INVALID CODE" );
                    }
                    else if( frame.mFlags & PAUSE_BREAK )
                    {
                        sprintf( tmp_str, "0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77" );
                        sprintf( codetype, "" );
                        sprintf( key_str, "[PAUSE/BREAK]" );
                    }
                    else if( frame.mFlags & PRINT_SCREEN && frame.mFlags & BREAK_CODE )
                    {
                        sprintf( tmp_str, "0xE0, 0xF0, 0x7C, 0xE0, 0xF0, 0x12" );
                        sprintf( codetype, "BREAK" );
                        sprintf( key_str, "[PRINT SCREEN]" );
                    }
                    else if( frame.mFlags & PRINT_SCREEN )
                    {
                        sprintf( tmp_str, "0xE0, 0x12, 0xE0, 0x7C" );
                        sprintf( codetype, "MAKE" );
                        sprintf( key_str, "[PRINT SCREEN]" );
                    }
                    else if( frame.mFlags & EXTENDED_KEY && frame.mFlags & BREAK_CODE )
                    {
                        sprintf( tmp_str, "0xE0, 0xF0, %s", num_str );
                        sprintf( codetype, "BREAK" );
                    }
                    else if( frame.mFlags & EXTENDED_KEY )
                    {
                        sprintf( tmp_str, "0xE0, %s", num_str );
                        sprintf( codetype, "MAKE" );
                    }
                    else if( frame.mFlags & BREAK_CODE )
                    {
                        sprintf( tmp_str, "0xF0, %s", num_str );
                        sprintf( codetype, "BREAK" );
                    }
                    else
                    {
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "MAKE" );
                    }

                    sprintf( num_str, "%s", tmp_str );

                    // write the info to the file
                    file_stream << time_str << "," << device_str << "," << codetype << "," << key_str << "," << num_str << std::endl;
                }
                else
                {
                    sprintf( device_str, "Mouse" );

                    char num_str[ 128 ];

                    char tmp_str[ 256 ];
                    char codetype[ 32 ];

                    char key_str[ 512 ];
                    GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );

                    if( frame.mFlags & DATA_FRAME )
                    {
                        if( frame.mData2 & ACK_FRAME )
                        {
                            AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "ACK" );
                            sprintf( key_str, "" );
                        }
                        else if( frame.mData2 & BAT_FRAME )
                        {
                            AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "BAT" );

                            sprintf( key_str, "Power-On Self Test Successfull" );
                        }
                    }
                    else if( frame.mFlags & MOVEMENT_FRAME )
                    {
                        AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 32, num_str, 128 );
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "MOVEMENT" );

                        U8 YOverflow = ( frame.mData1 & 0x80 ) >> 7;
                        U8 XOverflow = ( frame.mData1 & 0x40 ) >> 6;
                        U8 YSignBit = ( frame.mData1 & 0x20 ) >> 5;
                        U8 XSignBit = ( frame.mData1 & 0x10 ) >> 4;
                        U8 MiddleButton = ( frame.mData1 & 0x04 ) >> 2;
                        U8 RightButton = ( frame.mData1 & 0x02 ) >> 1;
                        U8 LeftButton = frame.mData1 & 0x01;

                        U8 Xmovement = ( frame.mData1 & 0xFF00 ) >> 8;
                        U8 Ymovement = ( frame.mData1 & 0xFF0000 ) >> 16;

                        if( mSettings->mDeviceType == 1 )
                            sprintf( key_str,
                                     "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left "
                                     "Btn: %d, deltaX: %d, deltaY: %d",
                                     YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, Xmovement,
                                     Ymovement );
                        else
                        {
                            U8 FifthButton = ( frame.mData1 & 0x20000000 ) >> 29;
                            U8 FourthButton = ( frame.mData1 & 0x1000000 ) >> 28;
                            U8 Zmovement = ( frame.mData1 & 0x0F000000 ) >> 24;

                            sprintf( key_str,
                                     "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left "
                                     "Btn: %d, 4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d",
                                     YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, FourthButton,
                                     FifthButton, Xmovement, Ymovement, Zmovement );
                        }
                    }
                    else
                    {
                        AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "DATA" );

                        sprintf( key_str, "" );
                    }
                    sprintf( num_str, "%s", tmp_str );

                    file_stream << time_str << "," << device_str << "," << codetype << "," << key_str << "," << num_str << std::endl;
                }
            }

            if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
            {
                file_stream.close();
                return;
            }
        }
    }

    UpdateExportProgressAndCheckForCancel( 0, 0 );
    file_stream.close();
}